

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O1

void ft_trig_pseudo_polarize(PVG_FT_Vector *vec)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  PVG_FT_Fixed *pPVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar8 = vec->x;
  lVar4 = vec->y;
  lVar2 = -lVar8;
  if (lVar8 < lVar4) {
    lVar6 = 0x5a0000;
    lVar3 = lVar4;
    if (lVar4 == lVar2 || SBORROW8(lVar4,lVar2) != lVar4 + lVar8 < 0) {
      lVar6 = -0xb40000;
      if (0 < lVar4) {
        lVar6 = 0xb40000;
      }
      lVar3 = lVar2;
      lVar2 = -lVar4;
    }
  }
  else if (SBORROW8(lVar4,lVar2) == lVar4 + lVar8 < 0) {
    lVar6 = 0;
    lVar3 = lVar8;
    lVar2 = lVar4;
  }
  else {
    lVar6 = -0x5a0000;
    lVar3 = -lVar4;
    lVar2 = lVar8;
  }
  pPVar7 = ft_trig_arctan_table;
  lVar4 = 1;
  lVar8 = 1;
  do {
    lVar9 = lVar8 + lVar2 >> ((byte)lVar4 & 0x3f);
    lVar10 = lVar8 + lVar3 >> ((byte)lVar4 & 0x3f);
    lVar1 = *pPVar7;
    if (lVar2 < 1) {
      lVar9 = -lVar9;
      lVar1 = -lVar1;
    }
    else {
      lVar10 = -lVar10;
    }
    lVar2 = lVar2 + lVar10;
    lVar6 = lVar6 + lVar1;
    lVar3 = lVar3 + lVar9;
    pPVar7 = pPVar7 + 1;
    lVar8 = lVar8 * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x17);
  if (lVar6 < 0) {
    uVar5 = -(0x10U - lVar6 & 0xffffffffffffffe0);
  }
  else {
    uVar5 = lVar6 + 0x10U & 0x7fffffffffffffe0;
  }
  vec->x = lVar3;
  vec->y = uVar5;
  return;
}

Assistant:

static void ft_trig_pseudo_polarize(PVG_FT_Vector* vec)
{
    PVG_FT_Angle        theta;
    PVG_FT_Int          i;
    PVG_FT_Fixed        x, y, xtemp, b;
    const PVG_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Get the vector into [-PI/4,PI/4] sector */
    if (y > x) {
        if (y > -x) {
            theta = PVG_FT_ANGLE_PI2;
            xtemp = y;
            y = -x;
            x = xtemp;
        } else {
            theta = y > 0 ? PVG_FT_ANGLE_PI : -PVG_FT_ANGLE_PI;
            x = -x;
            y = -y;
        }
    } else {
        if (y < -x) {
            theta = -PVG_FT_ANGLE_PI2;
            xtemp = -y;
            y = x;
            x = xtemp;
        } else {
            theta = 0;
        }
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < PVG_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        PVG_FT_Fixed v1 = ((y + b) >> i);
        PVG_FT_Fixed v2 = ((x + b) >> i);
        if (y > 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    /* round theta */
    if (theta >= 0)
        theta = PVG_FT_PAD_ROUND(theta, 32);
    else
        theta = -PVG_FT_PAD_ROUND(-theta, 32);

    vec->x = x;
    vec->y = theta;
}